

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int __thiscall
CVmObjFileName::getp_renameFile(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  CVmNetFile *this_00;
  CVmNetFile *newname;
  long *plVar6;
  uint uVar7;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  
  if (oargc == (uint *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *oargc;
  }
  if (getp_renameFile(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_renameFile(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_renameFile::desc.min_argc_ = 1;
      getp_renameFile::desc.opt_argc_ = 0;
      getp_renameFile::desc.varargs_ = 0;
      __cxa_guard_release(&getp_renameFile(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_renameFile::desc);
  if (iVar3 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"FileName.renameFile");
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar4;
    uVar5 = _ZTW11G_err_frame();
    *(err_frame_t **)uVar5 = &err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      this_00 = CVmObjFile::get_filename_from_obj(self,&rc,0x1005,0xb,"application/octet-stream");
      newname = CVmObjFile::get_filename_arg(sp_ + -1,&rc,0x1006,0,0xb,"application/octet-stream");
      CVmNetFile::rename_to(this_00,newname);
    }
    else {
      this_00 = (CVmNetFile *)0x0;
      newname = this_00;
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      if (this_00 != (CVmNetFile *)0x0) {
        CVmNetFile::abandon(this_00);
      }
      if (newname != (CVmNetFile *)0x0) {
        CVmNetFile::abandon(newname);
      }
    }
    peVar1 = err_cur__.prv_;
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = peVar1;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar4 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pCVar2 = err_cur__.exc_;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar6 + 0x10) = pCVar2;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    retval->typ = VM_NIL;
    sp_ = sp_ + -(long)(int)uVar7;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_renameFile(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* set up our recursive callback descriptor in case netfile needs it */
    vm_rcdesc rc(vmg_ "FileName.renameFile",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_RENAMEFILE, G_stk->get(0), argc);

    CVmNetFile *oldfile = 0, *newfile = 0;
    err_try
    {
        /* get the old filename from self; use the RENAME FROM access mode */
        oldfile = CVmObjFile::get_filename_from_obj(
            vmg_ self, &rc, VMOBJFILE_ACCESS_RENAME_FROM,
            OSFTUNK, "application/octet-stream");
        
        /* get the new filename argument; use RENAME TO access mode */
        newfile = CVmObjFile::get_filename_arg(
            vmg_ G_stk->get(0), &rc, VMOBJFILE_ACCESS_RENAME_TO, FALSE,
            OSFTUNK, "application/octet-stream");

        /* rename the file */
        oldfile->rename_to(vmg_ newfile);
    }